

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O1

void expression_eval(FILE *out,char *valueIn,_Bool returnString)

{
  undefined4 uVar1;
  FILE *out_00;
  int iVar2;
  char *pcVar3;
  s_pattern_match *psVar4;
  undefined7 in_register_00000011;
  long lVar5;
  long lVar6;
  char *__s;
  size_t __n;
  pattern_match_t *ppVar7;
  long lVar8;
  regmatch_t match [2];
  pattern_match_t *matches;
  pattern_type_t local_78;
  pattern_analyse_t local_74;
  undefined4 local_6c;
  regmatch_t local_68;
  int local_60;
  int local_5c;
  char *local_50;
  FILE *local_48;
  pattern_match_t *local_40;
  pattern_match_t *local_38;
  
  local_74.hasEquation = false;
  local_74.hasOperator = false;
  local_74.hasString = false;
  local_74.hasVariable = false;
  local_74.hasInt = false;
  local_74.hasFloat = false;
  iVar2 = strncmp(valueIn,"${",2);
  if (iVar2 != 0) {
    return;
  }
  local_6c = (undefined4)CONCAT71(in_register_00000011,returnString);
  local_48 = out;
  local_50 = strdup(valueIn);
  __s = local_50 + 2;
  pcVar3 = strchr(__s,0x7d);
  *pcVar3 = '\0';
  psVar4 = (pattern_match_t *)0x0;
  ppVar7 = psVar4;
  do {
    local_40 = ppVar7;
    ppVar7 = local_40;
    iVar2 = regexec((regex_t *)&regexFloat,__s,2,&local_68,0);
    local_38 = psVar4;
    if (iVar2 == 0) {
      local_74.hasFloat = true;
      local_78 = FLOAT;
LAB_00104c20:
      lVar6 = 0;
    }
    else {
      iVar2 = regexec((regex_t *)&regexInt,__s,2,&local_68,0);
      if (iVar2 == 0) {
        local_74.hasInt = true;
        lVar6 = 0;
        local_78 = INT;
      }
      else {
        iVar2 = regexec((regex_t *)&regexString,__s,2,&local_68,0);
        if (iVar2 != 0) {
          iVar2 = regexec((regex_t *)&regexEquation,__s,2,&local_68,0);
          if (iVar2 == 0) {
            local_74.hasEquation = true;
            local_78 = EQUATION;
          }
          else {
            iVar2 = regexec((regex_t *)&regexOperator,__s,2,&local_68,0);
            if (iVar2 == 0) {
              local_74.hasOperator = true;
              local_78 = OPERATOR;
            }
            else {
              iVar2 = regexec((regex_t *)&regexVariable,__s,2,&local_68,0);
              if (iVar2 == 0) {
                local_74.hasVariable = true;
                local_78 = VARIABLE;
              }
              else {
                iVar2 = regexec((regex_t *)&regexPopen,__s,2,&local_68,0);
                if (iVar2 == 0) {
                  local_78 = POPEN;
                }
                else {
                  iVar2 = regexec((regex_t *)&regexPclose,__s,2,&local_68,0);
                  if (iVar2 == 0) {
                    local_78 = PCLOSE;
                  }
                  else {
                    iVar2 = regexec((regex_t *)&regexNot,__s,2,&local_68,0);
                    if (iVar2 != 0) {
                      iVar2 = regexec((regex_t *)&regexEmpty,__s,2,&local_68,0);
                      out_00 = local_48;
                      pcVar3 = local_50;
                      uVar1 = local_6c;
                      if (iVar2 != 0) {
                        if (ppVar7 != (pattern_match_t *)0x0) {
                          free(ppVar7);
                        }
                        ppVar7 = (pattern_match_t *)0x0;
                      }
                      builder_generateCode(out_00,ppVar7,&local_74,SUB41(uVar1,0));
                      free(pcVar3);
                      expression_free(ppVar7);
                      return;
                    }
                    local_78 = NOT;
                  }
                }
              }
            }
          }
          goto LAB_00104c20;
        }
        local_74.hasString = true;
        local_78 = STRING;
        lVar6 = 1;
      }
    }
    psVar4 = (s_pattern_match *)malloc(0x18);
    lVar8 = (long)local_5c;
    lVar5 = (long)local_60;
    __n = lVar8 - lVar5;
    pcVar3 = (char *)calloc(1,__n + 1);
    psVar4->string = pcVar3;
    strncpy(pcVar3,__s + lVar5,__n);
    __s = __s + lVar8 + lVar6;
    psVar4->type = local_78;
    psVar4->next = (s_pattern_match *)0x0;
    ppVar7 = psVar4;
    if (local_40 != (pattern_match_t *)0x0) {
      local_38->next = psVar4;
      ppVar7 = local_40;
    }
  } while( true );
}

Assistant:

void expression_eval(FILE *out, char *valueIn, bool returnString) {
	pattern_analyse_t analysation;
	analysation.hasEquation = false;
	analysation.hasFloat = false;
	analysation.hasInt = false;
	analysation.hasOperator = false;
	analysation.hasString = false;
	analysation.hasVariable = false;

	char *tmp;
	if ( !strncmp(valueIn, "${", 2) ) {
		char *dup = strdup(valueIn);
		char *expr = dup;
		expr += 2;
		tmp = strchr(expr, '}');
		*tmp = '\0';

		pattern_match_t *matches = expression_extract(&analysation, expr);
		builder_generateCode(out, matches, &analysation, returnString);

		free(dup);
		expression_free(matches);
	}
}